

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::GetFileName_abi_cxx11_
          (string *__return_storage_ptr__,python *this,FileDescriptor *file_des,string_view suffix)

{
  string_view filename;
  string module_name;
  AlphaNum local_50;
  
  filename._M_str = (char *)suffix._M_len;
  filename._M_len = **(size_t **)(this + 8);
  ModuleName_abi_cxx11_(&module_name,(python *)(*(size_t **)(this + 8))[1],filename);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&module_name);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)&local_50,(char (*) [2])0x41082e,(char (*) [2])0x365c68);
  absl::lts_20240722::StrReplaceAll(&local_50,1,__return_storage_ptr__);
  local_50.piece_._M_len = (size_t)file_des;
  local_50.piece_._M_str = filename._M_str;
  absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&module_name);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileName(const FileDescriptor* file_des,
                        absl::string_view suffix) {
  std::string module_name = ModuleName(file_des->name());
  std::string filename = module_name;
  absl::StrReplaceAll({{".", "/"}}, &filename);
  absl::StrAppend(&filename, suffix);
  return filename;
}